

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_package.c
# Opt level: O0

int luaopen_package(lua_State *L)

{
  int iVar1;
  lua_CFunction in_RDI;
  int unaff_retaddr;
  int unaff_retaddr_00;
  int noenv;
  int i;
  lua_State *in_stack_00000018;
  lua_State *in_stack_00000020;
  int in_stack_0000002c;
  lua_State *in_stack_00000030;
  int in_stack_ffffffffffffffe8;
  int in_stack_ffffffffffffffec;
  int in_stack_fffffffffffffff0;
  int in_stack_fffffffffffffff4;
  int noenv_00;
  int idx;
  
  luaL_newmetatable(in_stack_00000020,(char *)in_stack_00000018);
  lj_lib_pushcc((lua_State *)CONCAT44(unaff_retaddr_00,unaff_retaddr),in_RDI,
                in_stack_fffffffffffffff4,in_stack_fffffffffffffff0);
  lua_setfield(in_stack_00000030,in_stack_0000002c,(char *)in_stack_00000020);
  luaL_register((lua_State *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0),
                (char *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
                (luaL_Reg *)0x13ad70);
  lua_copy((lua_State *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0),
           in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8);
  lua_createtable(_noenv,unaff_retaddr_00,unaff_retaddr);
  for (noenv_00 = 0; package_loaders[noenv_00] != (lua_CFunction)0x0; noenv_00 = noenv_00 + 1) {
    lj_lib_pushcc((lua_State *)CONCAT44(unaff_retaddr_00,unaff_retaddr),in_RDI,noenv_00,
                  in_stack_fffffffffffffff0);
    lua_rawseti(_noenv,unaff_retaddr_00,unaff_retaddr);
  }
  lua_setfield(in_stack_00000030,in_stack_0000002c,(char *)in_stack_00000020);
  lua_getfield(in_stack_00000030,in_stack_0000002c,(char *)in_stack_00000020);
  iVar1 = lua_toboolean((lua_State *)CONCAT44(noenv_00,in_stack_fffffffffffffff0),
                        in_stack_ffffffffffffffec);
  lua_settop((lua_State *)CONCAT44(noenv_00,iVar1),in_stack_ffffffffffffffec);
  setpath(L,(char *)_noenv,(char *)CONCAT44(unaff_retaddr_00,unaff_retaddr),(char *)in_RDI,noenv_00)
  ;
  setpath(L,(char *)_noenv,(char *)CONCAT44(unaff_retaddr_00,unaff_retaddr),(char *)in_RDI,noenv_00)
  ;
  lua_pushlstring(_noenv,(char *)CONCAT44(unaff_retaddr_00,unaff_retaddr),(size_t)in_RDI);
  idx = (int)((ulong)in_RDI >> 0x20);
  lua_setfield(in_stack_00000030,in_stack_0000002c,(char *)in_stack_00000020);
  luaL_findtable(in_stack_00000018,L._4_4_,(char *)_noenv,unaff_retaddr_00);
  lua_setfield(in_stack_00000030,in_stack_0000002c,(char *)in_stack_00000020);
  luaL_findtable(in_stack_00000018,L._4_4_,(char *)_noenv,unaff_retaddr_00);
  lua_setfield(in_stack_00000030,in_stack_0000002c,(char *)in_stack_00000020);
  lua_pushvalue((lua_State *)CONCAT44(unaff_retaddr_00,unaff_retaddr),idx);
  luaL_register((lua_State *)CONCAT44(noenv_00,iVar1),
                (char *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
                (luaL_Reg *)0x13af3c);
  lua_settop((lua_State *)CONCAT44(noenv_00,iVar1),in_stack_ffffffffffffffec);
  return 1;
}

Assistant:

LUALIB_API int luaopen_package(lua_State *L)
{
  int i;
  int noenv;
  luaL_newmetatable(L, "_LOADLIB");
  lj_lib_pushcf(L, lj_cf_package_unloadlib, 1);
  lua_setfield(L, -2, "__gc");
  luaL_register(L, LUA_LOADLIBNAME, package_lib);
  lua_copy(L, -1, LUA_ENVIRONINDEX);
  lua_createtable(L, sizeof(package_loaders)/sizeof(package_loaders[0])-1, 0);
  for (i = 0; package_loaders[i] != NULL; i++) {
    lj_lib_pushcf(L, package_loaders[i], 1);
    lua_rawseti(L, -2, i+1);
  }
#if LJ_52
  lua_pushvalue(L, -1);
  lua_setfield(L, -3, "searchers");
#endif
  lua_setfield(L, -2, "loaders");
  lua_getfield(L, LUA_REGISTRYINDEX, "LUA_NOENV");
  noenv = lua_toboolean(L, -1);
  lua_pop(L, 1);
  setpath(L, "path", LUA_PATH, LUA_PATH_DEFAULT, noenv);
  setpath(L, "cpath", LUA_CPATH, LUA_CPATH_DEFAULT, noenv);
  lua_pushliteral(L, LUA_PATH_CONFIG);
  lua_setfield(L, -2, "config");
  luaL_findtable(L, LUA_REGISTRYINDEX, "_LOADED", 16);
  lua_setfield(L, -2, "loaded");
  luaL_findtable(L, LUA_REGISTRYINDEX, "_PRELOAD", 4);
  lua_setfield(L, -2, "preload");
  lua_pushvalue(L, LUA_GLOBALSINDEX);
  luaL_register(L, NULL, package_global);
  lua_pop(L, 1);
  return 1;
}